

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int begin_set_handle_max(BEGIN_HANDLE begin,handle handle_max_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  BEGIN_INSTANCE *begin_instance;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    iVar2 = 0xbda;
  }
  else {
    item_value = amqpvalue_create_uint(handle_max_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0xbe2;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,4,item_value);
      iVar2 = 0xbe8;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int begin_set_handle_max(BEGIN_HANDLE begin, handle handle_max_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE handle_max_amqp_value = amqpvalue_create_handle(handle_max_value);
        if (handle_max_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 4, handle_max_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(handle_max_amqp_value);
        }
    }

    return result;
}